

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

void rehashtab(lua_State *L,GCtab *t,cTValue *ek)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t local_c8;
  uint32_t local_c4;
  uint local_a8;
  uint32_t i;
  uint32_t na;
  uint32_t asize;
  uint32_t total;
  uint32_t bins [28];
  cTValue *ek_local;
  GCtab *t_local;
  lua_State *L_local;
  
  for (local_a8 = 0; local_a8 < 0x1c; local_a8 = local_a8 + 1) {
    (&asize)[local_a8] = 0;
  }
  i = countarray(t,&asize);
  na = i + 1;
  uVar2 = counthash(t,&asize,&i);
  na = uVar2 + na;
  uVar2 = countint(ek,&asize);
  i = uVar2 + i;
  uVar2 = bestasize(&asize,&i);
  na = na - uVar2;
  if (na == 0) {
    local_c8 = 0;
  }
  else {
    if (na == 1) {
      local_c4 = 1;
    }
    else {
      iVar1 = 0x1f;
      if (na - 1 != 0) {
        for (; na - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      local_c4 = iVar1 + 1;
    }
    local_c8 = local_c4;
  }
  lj_tab_resize(L,t,i,local_c8);
  return;
}

Assistant:

static void rehashtab(lua_State *L, GCtab *t, cTValue *ek)
{
  uint32_t bins[LJ_MAX_ABITS];
  uint32_t total, asize, na, i;
  for (i = 0; i < LJ_MAX_ABITS; i++) bins[i] = 0;
  asize = countarray(t, bins);
  total = 1 + asize;
  total += counthash(t, bins, &asize);
  asize += countint(ek, bins);
  na = bestasize(bins, &asize);
  total -= na;
  lj_tab_resize(L, t, asize, hsize2hbits(total));
}